

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

void elf_initsymlist(SymTabList *sl,StrTabList *strl,size_t tabsize,size_t symsize,
                    _func_void_void_ptr_uint32_t_uint64_t_uint64_t_uint8_t_uint8_t_uint16_t_bool
                    *init)

{
  SymbolNode **ppSVar1;
  
  initlist(&sl->l);
  sl->htabsize = tabsize;
  ppSVar1 = (SymbolNode **)alloczero(tabsize << 3);
  sl->hashtab = ppSVar1;
  sl->strlist = strl;
  sl->elfsymsize = symsize;
  sl->initsym = init;
  sl->nextindex = 0;
  sl->globalindex = 0;
  elf_addsym(sl,"",0,0,'\0','\0',0);
  return;
}

Assistant:

void elf_initsymlist(struct SymTabList *sl,struct StrTabList *strl,
                     size_t tabsize,size_t symsize,
                     void (*init)(void *,uint32_t,uint64_t,uint64_t,
                                  uint8_t,uint8_t,uint16_t,bool))
{
  initlist(&sl->l);
  sl->htabsize = tabsize;
  sl->hashtab = alloczero(tabsize * sizeof(struct SymbolNode *));
  sl->strlist = strl;
  sl->elfsymsize = symsize;
  sl->initsym = init;
  sl->nextindex = sl->globalindex = 0;
  elf_addsym(sl,noname,0,0,0,0,SHN_UNDEF);
}